

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall
Scene::load_buffers_and_draw_cmd
          (Scene *this,shared_ptr<myvk::Queue> *graphics_queue,
          vector<Scene::Mesh,_std::allocator<Scene::Mesh>_> *meshes)

{
  vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_> *this_00;
  pointer pDVar1;
  void *__src;
  element_type *peVar2;
  pointer puVar3;
  pointer puVar4;
  undefined8 vertex_count;
  uint uVar5;
  pointer pVVar6;
  size_t sVar7;
  ulong uVar8;
  Ptr<Device> *device;
  Mesh *mesh;
  pointer pMVar9;
  pointer pVVar10;
  ulong index_count_00;
  uint uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *size;
  uint uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *size_00;
  initializer_list<VkBufferCopy> __l;
  initializer_list<VkBufferCopy> __l_00;
  uint32_t index_count;
  allocator_type local_149;
  vector<unsigned_int,_std::allocator<unsigned_int>_> remap;
  vector<Vertex,_std::allocator<Vertex>_> vertices;
  vector<Vertex,_std::allocator<Vertex>_> naive_vertices;
  Ptr<BufferBase> local_e8;
  Ptr<BufferBase> local_d8;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  undefined1 local_98 [40];
  shared_ptr<myvk::Fence> fence;
  shared_ptr<myvk::CommandPool> command_pool;
  shared_ptr<myvk::Buffer> index_staging_buffer;
  shared_ptr<myvk::Buffer> vertex_staging_buffer;
  
  pDVar1 = (this->m_draw_commands).
           super__Vector_base<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_draw_commands).super__Vector_base<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar1) {
    (this->m_draw_commands).super__Vector_base<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>.
    _M_impl.super__Vector_impl_data._M_finish = pDVar1;
  }
  this_00 = &this->m_draw_commands;
  index_count = 0;
  naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  for (pMVar9 = (meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar9 != (meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>)._M_impl.
                super__Vector_impl_data._M_finish; pMVar9 = pMVar9 + 1) {
    index_count = index_count +
                  (int)(((long)(pMVar9->m_vertices).
                               super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pMVar9->m_vertices).
                              super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x14);
  }
  local_98._24_8_ = graphics_queue;
  std::vector<Vertex,_std::allocator<Vertex>_>::resize(&naive_vertices,(ulong)index_count);
  std::vector<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>::resize
            (this_00,((long)(meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>).
                           _M_impl.super__Vector_impl_data._M_start) / 0x28);
  uVar11 = 0;
  uVar12 = 0;
  while( true ) {
    uVar8 = (ulong)uVar12;
    pMVar9 = (meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9) / 0x28) <= uVar8)
    break;
    (this_00->super__Vector_base<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8].m_push_constant.m_texture_id =
         pMVar9[uVar8].m_texture_id;
    vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(pMVar9[uVar8].m_albedo.field_1,pMVar9[uVar8].m_albedo.field_0);
    vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(ulong)(uint)pMVar9[uVar8].m_albedo.field_2;
    uVar5 = glm::packUnorm4x8((vec4 *)&vertices);
    pDVar1 = (this_00->super__Vector_base<Scene::DrawCmd,_std::allocator<Scene::DrawCmd>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pDVar1[uVar8].m_push_constant.m_albedo = uVar5;
    pDVar1[uVar8].m_first_index = uVar11;
    __src = pMVar9[uVar8].m_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
            super__Vector_impl_data._M_start;
    pVVar6 = *(pointer *)
              ((long)&pMVar9[uVar8].m_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                      _M_impl + 8);
    pDVar1[uVar8].m_index_count = (uint32_t)(((long)pVVar6 - (long)__src) / 0x14);
    pVVar10 = pVVar6;
    if ((long)pVVar6 - (long)__src != 0) {
      memmove(naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
              super__Vector_impl_data._M_start + uVar11,__src,(long)pVVar6 - (long)__src);
      pVVar10 = pMVar9[uVar8].m_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl
                .super__Vector_impl_data._M_start;
      pVVar6 = *(pointer *)
                ((long)&pMVar9[uVar8].m_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>
                        ._M_impl + 8);
    }
    uVar11 = uVar11 + (int)(((long)pVVar6 - (long)pVVar10) / 0x14);
    uVar12 = uVar12 + 1;
  }
  vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&indices,(ulong)index_count,(allocator_type *)&remap);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&remap,(ulong)index_count,(allocator_type *)local_98);
  sVar7 = meshopt_generateVertexRemap
                    (remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,(uint *)0x0,(ulong)index_count,
                     naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                     super__Vector_impl_data._M_start,(ulong)index_count,0x14);
  std::vector<Vertex,_std::allocator<Vertex>_>::resize(&vertices,sVar7 & 0xffffffff);
  meshopt_remapIndexBuffer
            (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,(uint *)0x0,(ulong)index_count,
             remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  meshopt_remapVertexBuffer
            (vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start,
             naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start,(ulong)index_count,0x14,
             remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
      super__Vector_impl_data._M_start) {
    naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
    super__Vector_impl_data._M_finish =
         naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_98._32_8_ = sVar7 & 0xffffffff;
  std::vector<Vertex,_std::allocator<Vertex>_>::_M_shrink_to_fit(&naive_vertices);
  vertex_count = local_98._32_8_;
  uVar11 = 0;
  uVar12 = 0;
  while( true ) {
    uVar8 = (ulong)uVar12;
    pMVar9 = (meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(meshes->super__Vector_base<Scene::Mesh,_std::allocator<Scene::Mesh>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9) / 0x28) <= uVar8)
    break;
    uVar8 = ((long)*(pointer *)
                    ((long)&pMVar9[uVar8].m_vertices.
                            super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl + 8) -
            *(long *)&pMVar9[uVar8].m_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>.
                      _M_impl) / 0x14;
    index_count_00 = uVar8 & 0xffffffff;
    meshopt_optimizeVertexCache
              (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar11,
               indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar11,index_count_00,vertex_count);
    meshopt_optimizeOverdraw
              (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar11,
               indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar11,index_count_00,
               (float *)vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                        super__Vector_impl_data._M_start,vertex_count,0x14,1.05);
    uVar11 = uVar11 + (int)uVar8;
    uVar12 = uVar12 + 1;
  }
  meshopt_optimizeVertexFetch
            (vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start,
             indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,(ulong)index_count,
             vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start,local_98._32_8_,0x14);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                       super__Vector_impl_data._M_start) / 0x14);
  spdlog::info<char[32],unsigned_long,unsigned_int&>
            ((char (*) [32])"Mesh optimized ({}/{} vertices)",(unsigned_long *)&remap,&index_count);
  device = (Ptr<Device> *)(**(code **)(**(long **)local_98._24_8_ + 0x10))();
  puVar4 = indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar3 = indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  size = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (ulong)((int)vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                 (int)vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start & 0xfffffffc);
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create
            ((Buffer *)local_98,device,(VkDeviceSize)size,0,0x82,VMA_MEMORY_USAGE_AUTO,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&remap);
  std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_vertex_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&remap);
  size_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (ulong)((int)puVar4 - (int)puVar3 & 0xfffffffc);
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::Create
            ((Buffer *)local_98,device,(VkDeviceSize)size_00,0,0x42,VMA_MEMORY_USAGE_AUTO,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&remap);
  std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_index_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&remap);
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::
  CreateStaging<__gnu_cxx::__normal_iterator<Vertex*,std::vector<Vertex,std::allocator<Vertex>>>>
            ((Buffer *)&vertex_staging_buffer,device,
             (__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>)
             vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<Vertex_*,_std::vector<Vertex,_std::allocator<Vertex>_>_>)
             vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&remap);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&remap);
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  remap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  myvk::Buffer::
  CreateStaging<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((Buffer *)&index_staging_buffer,device,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&remap);
  std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::~vector
            ((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *
             )&remap);
  myvk::Fence::Create((Fence *)&fence,device,0);
  myvk::CommandPool::Create((CommandPool *)&command_pool,(Ptr<Queue> *)local_98._24_8_,0);
  myvk::CommandBuffer::Create
            ((CommandBuffer *)&command_buffer,&command_pool,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  myvk::CommandBuffer::Begin
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,1);
  peVar2 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             &vertex_staging_buffer.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
             &(this->m_vertex_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  local_98._0_8_ = (element_type *)0x0;
  local_98._8_8_ = (element_type *)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_98;
  local_98._16_8_ = size;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&remap,__l,&local_149);
  myvk::CommandBuffer::CmdCopy
            (peVar2,&local_d8,&local_e8,
             (vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&remap);
  std::_Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~_Vector_base
            ((_Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&remap);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  peVar2 = command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
             &index_staging_buffer.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_e8,
             &(this->m_index_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  local_98._0_8_ = (element_type *)0x0;
  local_98._8_8_ = (element_type *)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_98;
  local_98._16_8_ = size_00;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&remap,__l_00,&local_149);
  myvk::CommandBuffer::CmdCopy
            (peVar2,&local_d8,&local_e8,
             (vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&remap);
  std::_Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~_Vector_base
            ((_Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)&remap);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  myvk::CommandBuffer::End
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  myvk::CommandBuffer::Submit
            (command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,&fence);
  myvk::Fence::Wait(fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    0xffffffffffffffff);
  spdlog::info<char[35]>((char (*) [35])"Vertex and Index buffers generated");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&command_buffer.super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&command_pool.super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fence.super___shared_ptr<myvk::Fence,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index_staging_buffer.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&vertex_staging_buffer.super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<Vertex,_std::allocator<Vertex>_>::~_Vector_base
            (&vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>);
  std::_Vector_base<Vertex,_std::allocator<Vertex>_>::~_Vector_base
            (&naive_vertices.super__Vector_base<Vertex,_std::allocator<Vertex>_>);
  return;
}

Assistant:

void Scene::load_buffers_and_draw_cmd(const std::shared_ptr<myvk::Queue> &graphics_queue,
                                      const std::vector<Mesh> &meshes) {
	m_draw_commands.clear();

	// count vertices, set draw commands and vertex buffers
	uint32_t index_count = 0;
	std::vector<Vertex> naive_vertices;
	{
		for (const Mesh &mesh : meshes)
			index_count += mesh.m_vertices.size();
		naive_vertices.resize(index_count);
		m_draw_commands.resize(meshes.size());
		for (uint32_t i = 0, c = 0; i < meshes.size(); ++i) {
			const Mesh &mesh = meshes[i];
			m_draw_commands[i].m_push_constant.m_texture_id = mesh.m_texture_id;
			m_draw_commands[i].m_push_constant.m_albedo = glm::packUnorm4x8(glm::vec4(mesh.m_albedo, 0.0f));
			m_draw_commands[i].m_first_index = c;
			m_draw_commands[i].m_index_count = mesh.m_vertices.size();

			std::copy(mesh.m_vertices.begin(), mesh.m_vertices.end(), naive_vertices.begin() + c);
			c += mesh.m_vertices.size();
		}
	}

	// build index buffer and optimize meshes
	std::vector<Vertex> vertices;
	std::vector<uint32_t> indices(index_count);
	{
		std::vector<unsigned int> remap(index_count);
		uint32_t vertex_count = meshopt_generateVertexRemap(remap.data(), nullptr, index_count, naive_vertices.data(),
		                                                    index_count, sizeof(Vertex));
		vertices.resize(vertex_count);
		meshopt_remapIndexBuffer(indices.data(), nullptr, index_count, remap.data());
		meshopt_remapVertexBuffer(vertices.data(), naive_vertices.data(), index_count, sizeof(Vertex), remap.data());
		naive_vertices.clear();
		naive_vertices.shrink_to_fit();

		for (uint32_t i = 0, c = 0; i < meshes.size(); ++i) {
			uint32_t mesh_vert_cnt = meshes[i].m_vertices.size();
			meshopt_optimizeVertexCache(indices.data() + c, indices.data() + c, mesh_vert_cnt, vertex_count);
			meshopt_optimizeOverdraw(indices.data() + c, indices.data() + c, mesh_vert_cnt, &vertices[0].m_position.x,
			                         vertex_count, sizeof(Vertex), 1.05f);
			c += mesh_vert_cnt;
		}
		meshopt_optimizeVertexFetch(vertices.data(), indices.data(), index_count, vertices.data(), vertex_count,
		                            sizeof(Vertex));
	}
	spdlog::info("Mesh optimized ({}/{} vertices)", vertices.size(), index_count);

	const std::shared_ptr<myvk::Device> &device = graphics_queue->GetDevicePtr();
	uint32_t vertex_buffer_size = vertices.size() * sizeof(Vertex),
	         index_buffer_size = indices.size() * sizeof(uint32_t);
	m_vertex_buffer = myvk::Buffer::Create(device, vertex_buffer_size, 0,
	                                       VK_BUFFER_USAGE_VERTEX_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	m_index_buffer = myvk::Buffer::Create(device, index_buffer_size, 0,
	                                      VK_BUFFER_USAGE_INDEX_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT);

	std::shared_ptr<myvk::Buffer> vertex_staging_buffer =
	    myvk::Buffer::CreateStaging(device, vertices.begin(), vertices.end());
	std::shared_ptr<myvk::Buffer> index_staging_buffer =
	    myvk::Buffer::CreateStaging(device, indices.begin(), indices.end());

	std::shared_ptr<myvk::Fence> fence = myvk::Fence::Create(device);
	std::shared_ptr<myvk::CommandPool> command_pool = myvk::CommandPool::Create(graphics_queue);
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdCopy(vertex_staging_buffer, m_vertex_buffer, {{0, 0, vertex_buffer_size}});
	command_buffer->CmdCopy(index_staging_buffer, m_index_buffer, {{0, 0, index_buffer_size}});
	command_buffer->End();
	command_buffer->Submit(fence);

	fence->Wait();

	spdlog::info("Vertex and Index buffers generated");
}